

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeStringConst
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,string_view str)

{
  bool bVar1;
  string *this_00;
  string_view str_00;
  stringstream local_238 [8];
  stringstream wtf16;
  String local_228 [376];
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_b0;
  string local_88;
  string_view local_68;
  string local_58;
  allocator<char> local_31;
  
  std::__cxx11::stringstream::stringstream(local_238);
  str_00._M_str = (char *)annotations;
  str_00._M_len = (size_t)str._M_str;
  bVar1 = String::convertWTF8ToWTF16(local_228,(ostream *)str._M_len,str_00);
  if (bVar1) {
    std::__cxx11::stringbuf::str();
    IString::IString((IString *)&local_68,&local_58);
    IRBuilder::makeStringConst((Result<wasm::Ok> *)&local_b0,&this->irBuilder,(Name)local_68);
    withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,(Result<wasm::Ok> *)&local_b0);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              (&local_b0);
    this_00 = &local_58;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"invalid string constant",&local_31);
    Lexer::err((Err *)&local_58,&this->in,(ulong)pos,&local_88);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    this_00 = &local_88;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::stringstream::~stringstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeStringConst(Index pos,
                           const std::vector<Annotation>& annotations,
                           std::string_view str) {
    // Re-encode from WTF-8 to WTF-16.
    std::stringstream wtf16;
    if (!String::convertWTF8ToWTF16(wtf16, str)) {
      return in.err(pos, "invalid string constant");
    }
    // TODO: Use wtf16.view() once we have C++20.
    return withLoc(pos, irBuilder.makeStringConst(wtf16.str()));
  }